

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

void __thiscall Map::Map(Map *this,size_t columnNumber,size_t rowNumber)

{
  allocator_type local_39;
  value_type local_38;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> local_28;
  
  (this->map).
  super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->map).
  super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->map).
  super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_38.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::vector
            (&local_28,rowNumber,&local_38,&local_39);
  std::
  vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
  ::_M_fill_assign(&this->map,columnNumber,&local_28);
  std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::~vector
            (&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Map::Map(size_t columnNumber, size_t rowNumber) {
  map.assign(columnNumber, std::vector<std::shared_ptr<CellType> >(rowNumber, nullptr));
}